

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2d.cpp
# Opt level: O0

int main(void)

{
  initializer_list<int> xs;
  iterator __result;
  const_iterator __first;
  const_iterator __last;
  void *this;
  pair<const_int_*,_const_int_*> pVar1;
  int max_hourglass_value;
  Matrix<int,_4UL,_4UL> hourglasses;
  undefined1 local_78 [8];
  istream_iterator<int,_char,_std::char_traits<char>,_long> reader;
  int local_58 [10];
  iterator local_30;
  undefined8 local_28;
  Matrix<int,_3UL,_3UL> local_20;
  Matrix<int,_3UL,_3UL> kernel;
  Matrix<int,_6UL,_6UL> matrix;
  
  Matrix<int,_6UL,_6UL>::Matrix((Matrix<int,_6UL,_6UL> *)&kernel);
  local_58[4] = 1;
  local_58[5] = 0;
  local_58[6] = 1;
  local_58[7] = 1;
  local_58[0] = 1;
  local_58[1] = 1;
  local_58[2] = 1;
  local_58[3] = 0;
  local_58[8] = 1;
  local_30 = local_58;
  local_28 = 9;
  xs._M_len = 9;
  xs._M_array = local_30;
  Matrix<int,_3UL,_3UL>::Matrix(&local_20,xs);
  std::istream_iterator<int,_char,_std::char_traits<char>,_long>::istream_iterator
            ((istream_iterator<int,_char,_std::char_traits<char>,_long> *)local_78,
             (istream_type *)&std::cin);
  std::istream_iterator<int,_char,_std::char_traits<char>,_long>::istream_iterator
            ((istream_iterator<int,_char,_std::char_traits<char>,_long> *)&hourglasses,
             (istream_iterator<int,_char,_std::char_traits<char>,_long> *)local_78);
  __result = Matrix<int,_6UL,_6UL>::begin((Matrix<int,_6UL,_6UL> *)&kernel);
  std::copy_n<std::istream_iterator<int,char,std::char_traits<char>,long>,int,int*>
            ((istream_iterator<int,_char,_std::char_traits<char>,_long> *)&hourglasses,0x24,__result
            );
  Matrix<int,6ul,6ul>::conv<3ul,3ul>((Matrix<int,6ul,6ul> *)&stack0xffffffffffffff70,&kernel);
  Matrix<int,_6UL,_6UL>::dump((Matrix<int,_6UL,_6UL> *)&kernel,(ostream *)&std::cout);
  Matrix<int,_3UL,_3UL>::dump(&local_20,(ostream *)&std::cout);
  Matrix<int,_4UL,_4UL>::dump
            ((Matrix<int,_4UL,_4UL> *)&stack0xffffffffffffff70,(ostream *)&std::cout);
  __first = Matrix<int,_4UL,_4UL>::cbegin((Matrix<int,_4UL,_4UL> *)&stack0xffffffffffffff70);
  __last = Matrix<int,_4UL,_4UL>::cend((Matrix<int,_4UL,_4UL> *)&stack0xffffffffffffff70);
  pVar1 = std::minmax_element<int_const*>(__first,__last);
  this = (void *)std::ostream::operator<<(&std::cout,*pVar1.second);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Matrix<int,_4UL,_4UL>::~Matrix((Matrix<int,_4UL,_4UL> *)&stack0xffffffffffffff70);
  Matrix<int,_3UL,_3UL>::~Matrix(&local_20);
  Matrix<int,_6UL,_6UL>::~Matrix((Matrix<int,_6UL,_6UL> *)&kernel);
  return 0;
}

Assistant:

int main() {
  Matrix<int, 6, 6> matrix{};
  Matrix<int, 3, 3> kernel{1, 1, 1, 0, 1, 0, 1, 1, 1};
  auto reader = std::istream_iterator<int>(std::cin);
  std::copy_n(reader, 36, matrix.begin());
  auto hourglasses = matrix.conv(kernel);
  #ifndef NDEBUG
  matrix.dump(std::cout);
  kernel.dump(std::cout);
  hourglasses.dump(std::cout);
  #endif
  const int max_hourglass_value = *std::minmax_element(hourglasses.cbegin(), hourglasses.cend()).second;
  std::cout << max_hourglass_value << std::endl;
  return 0;
}